

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

int badpos(level *lev,int x,int y,monst *mtmp,uint gpflags)

{
  monst *pmVar1;
  boolean bVar2;
  uint uVar3;
  obj *poVar4;
  permonst *ppVar5;
  bool bVar6;
  uint local_3c;
  
  local_3c = 0;
  if (((mtmp != &youmonst) && (u.ux == x)) && (local_3c = 0, u.uy == y)) {
    local_3c = (uint)(u.usteed != mtmp || u.usteed == (monst *)0x0);
  }
  if (mtmp == (monst *)0x0) {
    ppVar5 = (permonst *)0x0;
  }
  else {
    pmVar1 = lev->monsters[x][y];
    if (((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) &&
       ((pmVar1 != mtmp || (mtmp->wormno != '\0')))) {
      local_3c = 1;
    }
    ppVar5 = mtmp->data;
    bVar2 = is_pool(lev,x,y);
    if (ppVar5->mlet == '9' && bVar2 == '\0') {
      uVar3 = mt_random();
      if (0x13b13b13 < uVar3 * -0x3b13b13b) {
        local_3c = 1;
      }
    }
    else if (bVar2 != '\0') {
      if (mtmp == &youmonst) {
        if (u.uprops[0x3c].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) {
          return local_3c;
        }
        if (((youmonst.data)->mflags1 & 1) != 0) {
          return local_3c;
        }
        if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 1) != 0)) {
          return local_3c;
        }
        if ((u.uprops[0x27].extrinsic != 0) &&
           (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) {
          return local_3c;
        }
        if (u.uprops[0x39].intrinsic != 0) {
          return local_3c;
        }
        if (u.uprops[0x39].extrinsic != 0) {
          return local_3c;
        }
        if (((youmonst.data)->mflags1 & 2) != 0) {
          return local_3c;
        }
        if (u.usteed == (monst *)0x0) {
          if (u.uprops[0x31].intrinsic != 0) {
            return local_3c;
          }
        }
        else if (((u.usteed)->data->mflags1 & 2) != 0 || u.uprops[0x31].intrinsic != 0) {
          return local_3c;
        }
        if (((youmonst.data)->mflags1 & 0x600) == 0 && u.uprops[0x31].extrinsic == 0) {
          u.uprops[0x39].extrinsic = 0;
          u.uprops[0x39].intrinsic = 0;
          return -1;
        }
        return local_3c;
      }
      bVar6 = (ppVar5->mflags1 & 0x13) == 0;
      goto LAB_00259fa5;
    }
    bVar2 = is_lava(lev,x,y);
    if (bVar2 != '\0') {
      if (mtmp != &youmonst) {
        uVar3 = 0xffffffff;
        if (ppVar5 == mons + 0x157) {
          uVar3 = local_3c;
        }
        if (ppVar5 == mons + 0xa0) {
          uVar3 = local_3c;
        }
        if ((ppVar5->mflags1 & 1) != 0) {
          return local_3c;
        }
        return uVar3;
      }
      bVar6 = u.uprops[0x12].intrinsic == 0;
LAB_00259fa5:
      return -(uint)bVar6 | local_3c;
    }
    if (((ppVar5->mflags1 & 8) != 0) && (bVar2 = may_passwall(lev,(xchar)x,(xchar)y), bVar2 != '\0')
       ) {
      return local_3c;
    }
  }
  if (lev->locations[x][y].typ < '\x17') {
    is_pool(lev,x,y);
    return -1;
  }
  bVar2 = closed_door(lev,x,y);
  if (bVar2 != '\0') {
    if (ppVar5 == (permonst *)0x0) {
      return 1;
    }
    if ((ppVar5->mflags1 & 4) == 0) {
      if ((ppVar5->mflags1 >> 0xd & 1) == 0) {
        return -(uint)(ppVar5->msize == '\0') | 1;
      }
      return -1;
    }
  }
  poVar4 = sobj_at(0x214,lev,x,y);
  if (poVar4 != (obj *)0x0) {
    if (ppVar5 == (permonst *)0x0) {
      return 1;
    }
    if ((ppVar5->mflags2 & 0x8000000) == 0) {
      return -1;
    }
  }
  return local_3c;
}

Assistant:

static int badpos(struct level *lev, int x, int y, struct monst *mtmp,
		   unsigned gpflags)
{
	int is_badpos = 0, pool;
	const struct permonst *mdat = NULL;
	boolean ignorewater = ((gpflags & MM_IGNOREWATER) != 0);
	struct monst *mtmp2;

	/* in many cases, we're trying to create a new monster, which
	 * can't go on top of the player or any existing monster.
	 * however, occasionally we are relocating engravings or objects,
	 * which could be co-located and thus get restricted a bit too much.
	 * oh well.
	 */
	if (mtmp != &youmonst && x == u.ux && y == u.uy &&
		(!u.usteed || mtmp != u.usteed))
	    is_badpos = 1;

	if (mtmp) {
	    mtmp2 = m_at(lev, x, y);

	    /* Be careful with long worms.  A monster may be placed back in
	     * its own location.  Normally, if m_at() returns the same monster
	     * that we're trying to place, the monster is being placed in its
	     * own location.  However, that is not correct for worm segments,
	     * because all the segments of the worm return the same m_at().
	     * Actually we overdo the check a little bit--a worm can't be placed
	     * in its own location, period.  If we just checked for mtmp->mx
	     * != x || mtmp->my != y, we'd miss the case where we're called
	     * to place the worm segment and the worm's head is at x,y.
	     */
	    if (mtmp2 && (mtmp2 != mtmp || mtmp->wormno))
		is_badpos = 1;

	    mdat = mtmp->data;
	    pool = is_pool(lev, x, y);
	    if (mdat->mlet == S_EEL && !pool && rn2(13) && !ignorewater)
		is_badpos = 1;

	    if (pool && !ignorewater) {
		if (mtmp == &youmonst)
			return (HLevitation || Flying || Wwalking ||
				Swimming || Amphibious) ? is_badpos : -1;
		else	return (is_flyer(mdat) || is_swimmer(mdat) ||
				is_clinger(mdat)) ? is_badpos : -1;
	    } else if (is_lava(lev, x, y)) {
		if (mtmp == &youmonst)
		    return HLevitation ? is_badpos : -1;
		else
		    return (is_flyer(mdat) || likes_lava(mdat)) ?
			    is_badpos : -1;
	    }
	    if (passes_walls(mdat) && may_passwall(lev, x, y)) return is_badpos;
	}
	if (!ACCESSIBLE(lev->locations[x][y].typ)) {
	    if (!(is_pool(lev, x, y) && ignorewater)) return -1;
	}

	if (closed_door(lev, x, y) && (!mdat || !amorphous(mdat)))
	    return mdat && (nohands(mdat) || verysmall(mdat)) ? -1 : 1;
	if (sobj_at(BOULDER, lev, x, y) && (!mdat || !throws_rocks(mdat)))
	    return mdat ? -1 : 1;
	return is_badpos;
}